

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O2

void Bbr_bddPrint(DdManager *dd,DdNode *F)

{
  uint uVar1;
  int iVar2;
  DdGen *gen;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int *Cube;
  double Value;
  int *local_40;
  double local_38;
  
  if (F == (DdNode *)0x0) {
    pcVar4 = "NULL";
  }
  else if ((DdNode *)((ulong)dd->one ^ 1) == F) {
    pcVar4 = "Constant 0";
  }
  else {
    if (dd->one != F) {
      uVar1 = dd->size;
      gen = Cudd_FirstCube(dd,F,&local_40,&local_38);
      uVar5 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar5;
      }
      do {
        iVar2 = Cudd_IsGenEmpty(gen);
        if ((iVar2 != 0) && (iVar2 = Cudd_GenFree(gen), iVar2 == 0)) {
          return;
        }
        if (uVar5 != 0) {
          printf(" + ");
        }
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          pcVar4 = "[%d]\'";
          if (local_40[uVar5] == 0) {
LAB_0074d733:
            printf(pcVar4,uVar5 & 0xffffffff);
          }
          else if (local_40[uVar5] == 1) {
            pcVar4 = "[%d]";
            goto LAB_0074d733;
          }
        }
        Cudd_NextCube(gen,&local_40,&local_38);
        uVar5 = 1;
      } while( true );
    }
    pcVar4 = "Constant 1";
  }
  printf(pcVar4);
  return;
}

Assistant:

void Bbr_bddPrint( DdManager * dd, DdNode * F )
{
    DdGen * Gen;
    int * Cube;
    CUDD_VALUE_TYPE Value;
    int nVars = dd->size;
    int fFirstCube = 1;
    int i;

    if ( F == NULL )
    {
        printf("NULL");
        return;
    }
    if ( F == b0 )
    {
        printf("Constant 0");
        return;
    }
    if ( F == b1 )
    {
        printf("Constant 1");
        return;
    }

    Cudd_ForeachCube( dd, F, Gen, Cube, Value )
    {
        if ( fFirstCube )
            fFirstCube = 0;
        else
//          Output << " + ";
            printf( " + " );

        for ( i = 0; i < nVars; i++ )
            if ( Cube[i] == 0 )
                printf( "[%d]'", i );
//              printf( "%c'", (char)('a'+i) );
            else if ( Cube[i] == 1 )
                printf( "[%d]", i );
//              printf( "%c", (char)('a'+i) );
    }

//  printf("\n");
}